

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall
QFontCache::insertEngine(QFontCache *this,Key *key,QFontEngine *engine,bool insertMulti)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  size_type_conflict sVar4;
  int *piVar5;
  byte in_CL;
  QFontEngine *in_RDX;
  Key *in_RSI;
  QMultiMap<QFontCache::Key,_QFontCache::Engine> *in_RDI;
  long in_FS_OFFSET;
  Engine data;
  iterator in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  QMultiMap<QFontCache::Key,_QFontCache::Engine> *this_00;
  undefined1 local_20 [16];
  QFontEngine *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_CL & 1;
  this_00 = in_RDI;
  local_10 = in_RDX;
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x7189d5);
  if (0x2000 < *(uint *)&in_RDI[5].d.d.ptr) {
    sVar4 = QMultiMap<QFontCache::Key,_QFontCache::Engine>::size(in_RDI);
    if (0xff < sVar4) {
      decreaseCache((QFontCache *)key);
    }
  }
  local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  Engine::Engine((Engine *)local_20,local_10);
  uVar3 = *(int *)&in_RDI[6].d.d.ptr + 1;
  *(uint *)&in_RDI[6].d.d.ptr = uVar3;
  local_20._8_4_ = uVar3;
  if ((bVar2 & 1) == 0) {
    in_stack_ffffffffffffffb8._M_node =
         (_Base_ptr)
         QMultiMap<QFontCache::Key,_QFontCache::Engine>::replace
                   (this_00,in_RSI,(Engine *)CONCAT17(bVar2,in_stack_ffffffffffffffc8));
  }
  else {
    in_stack_ffffffffffffffc0._M_node =
         (_Base_ptr)
         QMultiMap<QFontCache::Key,_QFontCache::Engine>::insert
                   (this_00,in_RSI,(Engine *)CONCAT17(bVar2,in_stack_ffffffffffffffc8));
  }
  piVar5 = QHash<QFontEngine_*,_int>::operator[]
                     ((QHash<QFontEngine_*,_int> *)in_stack_ffffffffffffffc0._M_node,
                      (QFontEngine **)in_stack_ffffffffffffffb8._M_node);
  iVar1 = *piVar5;
  *piVar5 = iVar1 + 1;
  if (iVar1 + 1 == 1) {
    increaseCost((QFontCache *)in_stack_ffffffffffffffc0._M_node,
                 (uint)((ulong)in_stack_ffffffffffffffb8._M_node >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontCache::insertEngine(const Key &key, QFontEngine *engine, bool insertMulti)
{
    Q_ASSERT(engine != nullptr);
    Q_ASSERT(key.multi == (engine->type() == QFontEngine::Multi));

#ifdef QFONTCACHE_DEBUG
    FC_DEBUG("QFontCache: inserting new engine %p, refcount %d", engine, engine->ref.loadRelaxed());
    if (!insertMulti && engineCache.contains(key)) {
        FC_DEBUG("   QFontCache already contains engine %p for key=(%g %g %d %d %d)",
                 engineCache.value(key).data, key.def.pointSize,
                 key.def.pixelSize, key.def.weight, key.def.style, key.def.fixedPitch);
    }
#endif
    engine->ref.ref();
    // Decrease now rather than waiting
    if (total_cost > min_cost * 2 && engineCache.size() >= QFONTCACHE_DECREASE_TRIGGER_LIMIT)
        decreaseCache();

    Engine data(engine);
    data.timestamp = ++current_timestamp;

    if (insertMulti)
        engineCache.insert(key, data);
    else
        engineCache.replace(key, data);
    // only increase the cost if this is the first time we insert the engine
    if (++engineCacheCount[engine] == 1)
        increaseCost(engine->cache_cost);
}